

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# padding_pack8.h
# Opt level: O0

void ncnn::padding_reflect_pack8_avx(Mat *src,Mat *dst,int top,int bottom,int left,int right)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 *puVar4;
  int in_ECX;
  int in_EDX;
  undefined8 *in_RSI;
  long *in_RDI;
  int in_R8D;
  int in_R9D;
  __m256 _p_8;
  int x_8;
  __m256 _p_7;
  int x_7;
  __m256 _p_6;
  int x_6;
  float *ptr0_1;
  int y_2;
  __m256 _p_5;
  int x_5;
  __m256 _p_4;
  int x_4;
  __m256 _p_3;
  int x_3;
  int y_1;
  __m256 _p_2;
  int x_2;
  __m256 _p_1;
  int x_1;
  __m256 _p;
  int x;
  float *ptr0;
  int y;
  float *outptr;
  float *ptr;
  int local_4e4;
  int local_4a4;
  int local_474;
  undefined8 *local_470;
  int local_464;
  int local_424;
  int local_3e4;
  int local_3a8;
  int local_3a4;
  int local_364;
  int local_324;
  int local_2f4;
  undefined8 *local_2f0;
  int local_2e4;
  undefined8 *local_2e0;
  undefined8 *local_2d8;
  
  local_2e0 = (undefined8 *)*in_RSI;
  local_2d8 = (undefined8 *)(*in_RDI + (long)(in_EDX * *(int *)((long)in_RDI + 0x2c) * 8) * 4);
  for (local_2e4 = 0; local_2e4 < in_EDX; local_2e4 = local_2e4 + 1) {
    local_2f0 = local_2d8;
    for (local_2f4 = 0; local_2f4 < in_R8D; local_2f4 = local_2f4 + 1) {
      puVar4 = (undefined8 *)((long)local_2d8 + (long)((in_R8D - local_2f4) * 8) * 4);
      uVar1 = puVar4[1];
      uVar2 = puVar4[2];
      uVar3 = puVar4[3];
      *local_2e0 = *puVar4;
      local_2e0[1] = uVar1;
      local_2e0[2] = uVar2;
      local_2e0[3] = uVar3;
      local_2e0 = local_2e0 + 4;
    }
    for (local_324 = 0; local_324 < *(int *)((long)in_RDI + 0x2c); local_324 = local_324 + 1) {
      uVar1 = local_2f0[1];
      uVar2 = local_2f0[2];
      uVar3 = local_2f0[3];
      *local_2e0 = *local_2f0;
      local_2e0[1] = uVar1;
      local_2e0[2] = uVar2;
      local_2e0[3] = uVar3;
      local_2f0 = local_2f0 + 4;
      local_2e0 = local_2e0 + 4;
    }
    for (local_364 = 0; local_364 < in_R9D; local_364 = local_364 + 1) {
      puVar4 = (undefined8 *)((long)local_2f0 + (long)(local_364 << 3) * -4 + -0x40);
      uVar1 = puVar4[1];
      uVar2 = puVar4[2];
      uVar3 = puVar4[3];
      *local_2e0 = *puVar4;
      local_2e0[1] = uVar1;
      local_2e0[2] = uVar2;
      local_2e0[3] = uVar3;
      local_2e0 = local_2e0 + 4;
    }
    local_2d8 = (undefined8 *)((long)local_2d8 + (long)(*(int *)((long)in_RDI + 0x2c) << 3) * -4);
  }
  for (local_3a4 = 0; local_3a4 < (int)in_RDI[6]; local_3a4 = local_3a4 + 1) {
    for (local_3a8 = 0; local_3a8 < in_R8D; local_3a8 = local_3a8 + 1) {
      puVar4 = (undefined8 *)((long)local_2d8 + (long)((in_R8D - local_3a8) * 8) * 4);
      uVar1 = puVar4[1];
      uVar2 = puVar4[2];
      uVar3 = puVar4[3];
      *local_2e0 = *puVar4;
      local_2e0[1] = uVar1;
      local_2e0[2] = uVar2;
      local_2e0[3] = uVar3;
      local_2e0 = local_2e0 + 4;
    }
    for (local_3e4 = 0; local_3e4 < *(int *)((long)in_RDI + 0x2c); local_3e4 = local_3e4 + 1) {
      uVar1 = local_2d8[1];
      uVar2 = local_2d8[2];
      uVar3 = local_2d8[3];
      *local_2e0 = *local_2d8;
      local_2e0[1] = uVar1;
      local_2e0[2] = uVar2;
      local_2e0[3] = uVar3;
      local_2d8 = local_2d8 + 4;
      local_2e0 = local_2e0 + 4;
    }
    for (local_424 = 0; local_424 < in_R9D; local_424 = local_424 + 1) {
      puVar4 = (undefined8 *)((long)local_2d8 + (long)(local_424 << 3) * -4 + -0x40);
      uVar1 = puVar4[1];
      uVar2 = puVar4[2];
      uVar3 = puVar4[3];
      *local_2e0 = *puVar4;
      local_2e0[1] = uVar1;
      local_2e0[2] = uVar2;
      local_2e0[3] = uVar3;
      local_2e0 = local_2e0 + 4;
    }
  }
  local_2d8 = (undefined8 *)((long)local_2d8 + (long)(*(int *)((long)in_RDI + 0x2c) << 4) * -4);
  for (local_464 = 0; local_464 < in_ECX; local_464 = local_464 + 1) {
    local_470 = local_2d8;
    for (local_474 = 0; local_474 < in_R8D; local_474 = local_474 + 1) {
      puVar4 = (undefined8 *)((long)local_2d8 + (long)((in_R8D - local_474) * 8) * 4);
      uVar1 = puVar4[1];
      uVar2 = puVar4[2];
      uVar3 = puVar4[3];
      *local_2e0 = *puVar4;
      local_2e0[1] = uVar1;
      local_2e0[2] = uVar2;
      local_2e0[3] = uVar3;
      local_2e0 = local_2e0 + 4;
    }
    for (local_4a4 = 0; local_4a4 < *(int *)((long)in_RDI + 0x2c); local_4a4 = local_4a4 + 1) {
      uVar1 = local_470[1];
      uVar2 = local_470[2];
      uVar3 = local_470[3];
      *local_2e0 = *local_470;
      local_2e0[1] = uVar1;
      local_2e0[2] = uVar2;
      local_2e0[3] = uVar3;
      local_470 = local_470 + 4;
      local_2e0 = local_2e0 + 4;
    }
    for (local_4e4 = 0; local_4e4 < in_R9D; local_4e4 = local_4e4 + 1) {
      puVar4 = (undefined8 *)((long)local_470 + (long)(local_4e4 << 3) * -4 + -0x40);
      uVar1 = puVar4[1];
      uVar2 = puVar4[2];
      uVar3 = puVar4[3];
      *local_2e0 = *puVar4;
      local_2e0[1] = uVar1;
      local_2e0[2] = uVar2;
      local_2e0[3] = uVar3;
      local_2e0 = local_2e0 + 4;
    }
    local_2d8 = (undefined8 *)((long)local_2d8 + (long)(*(int *)((long)in_RDI + 0x2c) << 3) * -4);
  }
  return;
}

Assistant:

static void padding_reflect_pack8_avx(const Mat& src, Mat& dst, int top, int bottom, int left, int right)
{
    const float* ptr = src;
    float* outptr = dst;

    // fill top
    ptr += top * src.w * 8;
    for (int y = 0; y < top; y++)
    {
        const float* ptr0 = ptr;
        for (int x = 0; x < left; x++)
        {
            __m256 _p = _mm256_load_ps(ptr0 + (left - x) * 8);
            _mm256_store_ps(outptr, _p);
            outptr += 8;
        }
        for (int x = 0; x < src.w; x++)
        {
            __m256 _p = _mm256_load_ps(ptr0);
            _mm256_store_ps(outptr, _p);
            ptr0 += 8;
            outptr += 8;
        }
        for (int x = 0; x < right; x++)
        {
            __m256 _p = _mm256_load_ps(ptr0 - 16 - x * 8);
            _mm256_store_ps(outptr, _p);
            outptr += 8;
        }
        ptr -= src.w * 8;
    }
    // fill center
    for (int y = 0; y < src.h; y++)
    {
        for (int x = 0; x < left; x++)
        {
            __m256 _p = _mm256_load_ps(ptr + (left - x) * 8);
            _mm256_store_ps(outptr, _p);
            outptr += 8;
        }
        for (int x = 0; x < src.w; x++)
        {
            __m256 _p = _mm256_load_ps(ptr);
            _mm256_store_ps(outptr, _p);
            ptr += 8;
            outptr += 8;
        }
        for (int x = 0; x < right; x++)
        {
            __m256 _p = _mm256_load_ps(ptr - 16 - x * 8);
            _mm256_store_ps(outptr, _p);
            outptr += 8;
        }
    }
    // fill bottom
    ptr -= 2 * src.w * 8;
    for (int y = 0; y < bottom; y++)
    {
        const float* ptr0 = ptr;
        for (int x = 0; x < left; x++)
        {
            __m256 _p = _mm256_load_ps(ptr0 + (left - x) * 8);
            _mm256_store_ps(outptr, _p);
            outptr += 8;
        }
        for (int x = 0; x < src.w; x++)
        {
            __m256 _p = _mm256_load_ps(ptr0);
            _mm256_store_ps(outptr, _p);
            ptr0 += 8;
            outptr += 8;
        }
        for (int x = 0; x < right; x++)
        {
            __m256 _p = _mm256_load_ps(ptr0 - 16 - x * 8);
            _mm256_store_ps(outptr, _p);
            outptr += 8;
        }
        ptr -= src.w * 8;
    }
}